

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O1

void __thiscall Assimp::glTF2Exporter::ExportMetadata(glTF2Exporter *this)

{
  element_type *peVar1;
  aiMetadata *paVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  byte extraout_DL;
  ulong __n;
  ulong extraout_RDX;
  byte bVar9;
  ulong uVar10;
  long lVar11;
  char *pcVar12;
  size_t __n_00;
  bool bVar13;
  aiString copyright_str;
  char buffer [256];
  long *local_960;
  ulong local_958;
  long local_950 [2];
  uint local_93c;
  char local_938 [1024];
  char local_538 [260];
  uint local_434;
  undefined1 local_430 [1024];
  
  peVar1 = (this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  bVar9 = 0;
  std::__cxx11::string::_M_replace
            ((ulong)&(peVar1->asset).version,0,(char *)(peVar1->asset).version._M_string_length,
             0x6d25fe);
  uVar4 = aiGetVersionMajor();
  uVar5 = aiGetVersionMinor();
  uVar6 = aiGetVersionRevision();
  snprintf(local_538,0x100,"Open Asset Import Library (assimp v%d.%d.%d)",(ulong)uVar4,(ulong)uVar5,
           (ulong)uVar6);
  pcVar12 = (char *)(peVar1->asset).generator._M_string_length;
  strlen(local_538);
  std::__cxx11::string::_M_replace((ulong)&(peVar1->asset).generator,0,pcVar12,(ulong)local_538);
  local_93c = 0;
  local_938[0] = '\0';
  memset(local_938 + 1,0x1b,0x3ff);
  paVar2 = this->mScene->mMetaData;
  if (paVar2 != (aiMetadata *)0x0) {
    local_960 = local_950;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_960,"SourceAsset_Copyright","")
    ;
    __n_00 = 0x3ff;
    if ((local_958 & 0xfffffc00) == 0) {
      __n_00 = local_958 & 0xffffffff;
    }
    local_434 = (uint)__n_00;
    memcpy(local_430,local_960,__n_00);
    local_430[__n_00] = 0;
    uVar8 = (ulong)paVar2->mNumProperties;
    bVar13 = uVar8 != 0;
    bVar9 = extraout_DL;
    if (bVar13) {
      pcVar12 = paVar2->mKeys->data;
      bVar13 = true;
      uVar10 = 1;
      lVar11 = 0;
      do {
        __n = (ulong)((aiString *)(pcVar12 + -4))->length;
        if ((((aiString *)(pcVar12 + -4))->length == (uint)__n_00) &&
           (iVar7 = bcmp(pcVar12,local_430,__n), __n = extraout_RDX, iVar7 == 0)) {
          if (*(int *)((long)&paVar2->mValues->mType + lVar11) == 5) {
            puVar3 = *(uint **)((long)&paVar2->mValues->mData + lVar11);
            bVar9 = 1;
            if (puVar3 != &local_93c) {
              local_93c = *puVar3;
              uVar8 = (ulong)local_93c;
              memcpy(local_938,puVar3 + 1,uVar8);
              bVar9 = 1;
              local_938[uVar8] = '\0';
            }
          }
          else {
            bVar9 = 0;
          }
          break;
        }
        bVar9 = (byte)__n;
        bVar13 = uVar10 < uVar8;
        lVar11 = lVar11 + 0x10;
        uVar10 = uVar10 + 1;
        pcVar12 = pcVar12 + 0x404;
      } while (uVar8 << 4 != lVar11);
    }
    bVar9 = bVar13 & bVar9;
  }
  if ((paVar2 != (aiMetadata *)0x0) && (local_960 != local_950)) {
    operator_delete(local_960,local_950[0] + 1);
  }
  if (bVar9 != 0) {
    pcVar12 = (char *)(peVar1->asset).copyright._M_string_length;
    strlen(local_938);
    std::__cxx11::string::_M_replace((ulong)&peVar1->asset,0,pcVar12,(ulong)local_938);
  }
  return;
}

Assistant:

void glTF2Exporter::ExportMetadata()
{
    AssetMetadata& asset = mAsset->asset;
    asset.version = "2.0";

    char buffer[256];
    ai_snprintf(buffer, 256, "Open Asset Import Library (assimp v%d.%d.%d)",
        aiGetVersionMajor(), aiGetVersionMinor(), aiGetVersionRevision());

    asset.generator = buffer;

    // Copyright
	aiString copyright_str;
	if (mScene->mMetaData != nullptr && mScene->mMetaData->Get(AI_METADATA_SOURCE_COPYRIGHT, copyright_str)) {
        asset.copyright = copyright_str.C_Str();
	}
}